

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::clear_to_size(dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *this,size_type new_num_buckets)

{
  int iVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  pointer piVar4;
  ulong uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long lVar10;
  
  piVar4 = this->table;
  if (piVar4 == (pointer)0x0) {
    piVar2 = (this->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
             super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_;
    if (piVar2 != (int *)0x0) {
      *piVar2 = *piVar2 + 1;
    }
    piVar4 = (pointer)malloc(new_num_buckets * 4);
    this->table = piVar4;
  }
  else if (this->num_buckets != new_num_buckets) {
    resize_table(this,this->num_buckets,new_num_buckets);
    piVar4 = this->table;
  }
  auVar3 = _DAT_00a8f670;
  if (new_num_buckets != 0) {
    iVar1 = (this->key_info).empty_key;
    lVar10 = new_num_buckets - 1;
    auVar6._8_4_ = (int)lVar10;
    auVar6._0_8_ = lVar10;
    auVar6._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_00a8f670;
    auVar9 = _DAT_00a8f650;
    auVar11 = _DAT_00a8f660;
    do {
      auVar12 = auVar11 ^ auVar3;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar7 && auVar6._0_4_ < auVar12._0_4_ || iVar7 < auVar12._4_4_)
                & 1)) {
        piVar4[uVar5] = iVar1;
      }
      if ((auVar12._12_4_ != auVar6._12_4_ || auVar12._8_4_ <= auVar6._8_4_) &&
          auVar12._12_4_ <= auVar6._12_4_) {
        piVar4[uVar5 + 1] = iVar1;
      }
      auVar12 = auVar9 ^ auVar3;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar7 && (iVar13 != iVar7 || auVar12._0_4_ <= auVar6._0_4_)) {
        piVar4[uVar5 + 2] = iVar1;
        piVar4[uVar5 + 3] = iVar1;
      }
      uVar5 = uVar5 + 4;
      lVar10 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar10 + 4;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar10 + 4;
    } while ((new_num_buckets + 3 & 0xfffffffffffffffc) != uVar5);
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar8 = (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          enlarge_factor_ * (float)new_num_buckets;
  uVar5 = (ulong)fVar8;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  fVar8 = (float)new_num_buckets *
          (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          shrink_factor_;
  uVar5 = (ulong)fVar8;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }